

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.cpp
# Opt level: O3

void __thiscall pm::Rectangle::Rectangle(Rectangle *this,Vector3 *point,Vector3 *a,Vector3 *b)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Vector3 local_18;
  
  uVar1 = a->y;
  uVar3 = a->z;
  uVar2 = b->y;
  uVar4 = b->z;
  local_18.z = a->x * (float)uVar2 - b->x * (float)uVar1;
  local_18.y = b->x * (float)uVar3 - a->x * (float)uVar4;
  local_18.x = (float)uVar4 * (float)uVar1 - (float)uVar3 * (float)uVar2;
  Rectangle(this,point,a,b,&local_18);
  updateDimensions(this);
  return;
}

Assistant:

Rectangle::Rectangle(const Vector3 &point, const Vector3 &a, const Vector3 &b)
    : Rectangle(point, a, b, cross(a, b))
{
	updateDimensions();
}